

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_ubjson_ndarray_size
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *dim)

{
  bool bVar1;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_RDI;
  size_t i_1;
  size_t i;
  bool no_ndarray;
  size_t dimlen;
  pair<unsigned_long,_int> size_and_type;
  undefined1 in_stack_0000036f;
  pair<unsigned_long,_int> *in_stack_00000370;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_00000378;
  char_int_type in_stack_00000904;
  bool *in_stack_00000908;
  size_t *in_stack_00000910;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_00000918;
  value_type_conflict3 *in_stack_ffffffffffffffb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  pair<unsigned_long,_int> local_28 [2];
  bool local_1;
  
  std::pair<unsigned_long,_int>::pair<unsigned_long,_int,_true>(local_28);
  bVar1 = get_ubjson_size_type(in_stack_00000378,in_stack_00000370,(bool)in_stack_0000036f);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28[0].first ==
        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xffffffffffffffff) {
      while (in_RDI->current != 0x5d) {
        bVar1 = get_ubjson_size_value
                          (in_stack_00000918,in_stack_00000910,in_stack_00000908,in_stack_00000904);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        get_ignore_noop(in_RDI);
      }
    }
    else if (local_28[0].second == 0) {
      for (pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
          pvVar2 < local_28[0].first;
          pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(pvVar2->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
        bVar1 = get_ubjson_size_value
                          (in_stack_00000918,in_stack_00000910,in_stack_00000908,in_stack_00000904);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (in_stack_ffffffffffffffc0,(value_type_conflict3 *)pvVar2);
      }
    }
    else if (local_28[0].second != 0x4e) {
      for (pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
          pvVar2 < local_28[0].first;
          pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(pvVar2->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1)) {
        bVar1 = get_ubjson_size_value
                          (in_stack_00000918,in_stack_00000910,in_stack_00000908,in_stack_00000904);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (pvVar2,in_stack_ffffffffffffffb8);
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool get_ubjson_ndarray_size(std::vector<size_t>& dim)
    {
        std::pair<std::size_t, char_int_type> size_and_type;
        size_t dimlen = 0;
        bool no_ndarray = true;

        if (JSON_HEDLEY_UNLIKELY(!get_ubjson_size_type(size_and_type, no_ndarray)))
        {
            return false;
        }

        if (size_and_type.first != npos)
        {
            if (size_and_type.second != 0)
            {
                if (size_and_type.second != 'N')
                {
                    for (std::size_t i = 0; i < size_and_type.first; ++i)
                    {
                        if (JSON_HEDLEY_UNLIKELY(!get_ubjson_size_value(dimlen, no_ndarray, size_and_type.second)))
                        {
                            return false;
                        }
                        dim.push_back(dimlen);
                    }
                }
            }
            else
            {
                for (std::size_t i = 0; i < size_and_type.first; ++i)
                {
                    if (JSON_HEDLEY_UNLIKELY(!get_ubjson_size_value(dimlen, no_ndarray)))
                    {
                        return false;
                    }
                    dim.push_back(dimlen);
                }
            }
        }
        else
        {
            while (current != ']')
            {
                if (JSON_HEDLEY_UNLIKELY(!get_ubjson_size_value(dimlen, no_ndarray, current)))
                {
                    return false;
                }
                dim.push_back(dimlen);
                get_ignore_noop();
            }
        }
        return true;
    }